

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::FixupFirstLefts3(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  _func_int **pp_Var1;
  long lVar2;
  OutRec *pOVar3;
  size_type i;
  ulong uVar4;
  
  pp_Var1 = this->_vptr_Clipper;
  for (uVar4 = 0; lVar2 = *(long *)((long)&this->m_ClipType + (long)pp_Var1[-3]),
      uVar4 < (ulong)(*(long *)(pp_Var1[-3] +
                               (long)&(this->m_Maxima).
                                      super__List_base<long_long,_std::allocator<long_long>_>) -
                      lVar2 >> 3); uVar4 = uVar4 + 1) {
    lVar2 = *(long *)(lVar2 + uVar4 * 8);
    pOVar3 = ParseFirstLeft(*(OutRec **)(lVar2 + 8));
    if ((pOVar3 == OldOutRec) && (*(long *)(lVar2 + 0x18) != 0)) {
      *(OutRec **)(lVar2 + 8) = NewOutRec;
    }
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts3(OutRec* OldOutRec, OutRec* NewOutRec)
{
  //reassigns FirstLeft WITHOUT testing if NewOutRec contains the polygon
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts && firstLeft == OldOutRec)
      outRec->FirstLeft = NewOutRec;
  }
}